

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O1

size_t mtbdd_leafcount_mark(MTBDD mtbdd)

{
  uint8_t *puVar1;
  ulong uVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  
  lVar4 = 0;
  while ((mtbdd & 0x7fffffffffffffff) != 0) {
    puVar1 = nodes->data;
    lVar5 = (mtbdd & 0xffffffffff) * 0x10;
    uVar2 = *(ulong *)(puVar1 + lVar5);
    if ((uVar2 & 0x2000000000000000) != 0) break;
    *(ulong *)(puVar1 + lVar5) = uVar2 | 0x2000000000000000;
    if ((uVar2 >> 0x3e & 1) != 0) {
      lVar5 = 1;
      goto LAB_00118f85;
    }
    sVar3 = mtbdd_leafcount_mark(*(ulong *)(puVar1 + lVar5 + 8) & 0xffffffffff);
    lVar4 = lVar4 + sVar3;
    mtbdd = *(ulong *)(puVar1 + lVar5) & 0x800000ffffffffff;
  }
  lVar5 = 0;
LAB_00118f85:
  return lVar4 + lVar5;
}

Assistant:

static size_t
mtbdd_leafcount_mark(MTBDD mtbdd)
{
    if (mtbdd == mtbdd_true) return 0; // do not count true/false leaf
    if (mtbdd == mtbdd_false) return 0; // do not count true/false leaf
    mtbddnode_t n = MTBDD_GETNODE(mtbdd);
    if (mtbddnode_getmark(n)) return 0;
    mtbddnode_setmark(n, 1);
    if (mtbddnode_isleaf(n)) return 1; // count leaf as 1
    return mtbdd_leafcount_mark(mtbddnode_getlow(n)) + mtbdd_leafcount_mark(mtbddnode_gethigh(n));
}